

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O3

void show_script_do_proc(Am_Object *show_cmd)

{
  Am_Slot_Key AVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object script_window;
  Am_String name;
  Am_Object execute_command;
  Am_Object undo_db;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  
  pAVar2 = Am_Object::Get(show_cmd,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(&local_30,pAVar2);
  Am_Object::Get_Object(&local_38,(Am_Slot_Key)show_cmd,0x170);
  pAVar2 = Am_Object::Get(&local_38,0x68,0);
  Am_Object::Am_Object(&local_20,pAVar2);
  Am_Object::~Am_Object(&local_38);
  pAVar2 = Am_Object::Get(&local_30,0x150,0);
  Am_String::Am_String((Am_String *)&local_38,pAVar2);
  get_script_window(&local_40);
  Am_Object::Get_Object(&local_28,(Am_Slot_Key)&local_40,(ulong)Am_NAME_OBJECT);
  Am_Object::Set(&local_28,0x169,(Am_String *)&local_38,0);
  Am_Object::~Am_Object(&local_28);
  AVar1 = Am_SCRIPT_EXECUTE_COMMAND;
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_30);
  Am_Object::Set(&local_40,AVar1,pAVar3,0);
  AVar1 = Am_SHOW_SCRIPT_COMMAND;
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(show_cmd);
  Am_Object::Set(&local_40,AVar1,pAVar3,0);
  am_set_commands_into_script_window(&local_40,&local_30);
  Am_Object::Set(&local_40,0x69,true,0);
  Am_Object::~Am_Object(&local_40);
  Am_String::~Am_String((Am_String *)&local_38);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, show_script_do, (Am_Object show_cmd))
{
  Am_Object execute_command = show_cmd.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_Object undo_db = show_cmd.Get_Object(Am_SAVED_OLD_OWNER).Get(Am_WINDOW);
  Am_String name = execute_command.Get(Am_LABEL);

  Am_Object script_window = get_script_window(undo_db);
  script_window.Get_Object(Am_NAME_OBJECT).Set(Am_VALUE, name);
  script_window.Set(Am_SCRIPT_EXECUTE_COMMAND, execute_command);
  script_window.Set(Am_SHOW_SCRIPT_COMMAND, show_cmd);
  am_set_commands_into_script_window(script_window, execute_command);
  script_window.Set(Am_VISIBLE, true);
}